

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Clone::getMessage(Clone *this,int index)

{
  bool bVar1;
  int in_EDX;
  long in_RSI;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> in_RDI;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> this_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
       in_RDI.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  bVar1 = isValidIndex<int,std::vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>>
                    (in_RDI.
                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl._4_4_,
                     in_stack_ffffffffffffffc8);
  if (bVar1) {
    CLI::std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)(in_RSI + 0x140),(long)in_EDX);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator*
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               this_00._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
    std::make_unique<helics::Message,helics::Message&>
              ((Message *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  else {
    std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
    unique_ptr<std::default_delete<helics::Message>,void>
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               this_00._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl,
               in_stack_ffffffffffffffc8);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> Clone::getMessage(int index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}